

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_getbits.c
# Opt level: O2

int main(void)

{
  uint __line;
  char *__assertion;
  long in_FS_OFFSET;
  lrtr_ip_addr addr;
  char buf [16];
  lrtr_ip_addr local_38;
  undefined8 local_20;
  
  local_20 = *(undefined8 *)(in_FS_OFFSET + 0x28);
  addr._0_8_ = 0xaabbcc2200000000;
  lrtr_ip_addr_get_bits(&local_38,&addr,'\0',' ');
  if (local_38.u.addr6.addr[0] == 0xaabbcc22) {
    lrtr_ip_addr_get_bits((lrtr_ip_addr *)buf,&addr,'\0','\x01');
    local_38._0_8_ = buf._0_8_;
    local_38.u.addr6.addr[1]._0_1_ = buf[8];
    local_38.u.addr6.addr[1]._1_1_ = buf[9];
    local_38.u.addr6.addr[1]._2_1_ = buf[10];
    local_38.u.addr6.addr[1]._3_1_ = buf[0xb];
    local_38.u.addr6.addr[2]._0_1_ = buf[0xc];
    local_38.u.addr6.addr[2]._1_1_ = buf[0xd];
    local_38.u.addr6.addr[2]._2_1_ = buf[0xe];
    local_38.u.addr6.addr[2]._3_1_ = buf[0xf];
    __assertion = "result.u.addr4.addr == 0x80000000";
    __line = 0x18;
  }
  else {
    __assertion = "result.u.addr4.addr == 0xAABBCC22";
    __line = 0x15;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_getbits.c"
                ,__line,"void get_bits_testv4(void)");
}

Assistant:

int main(void)
{
	get_bits_testv4();
	get_bits_testv6();
	printf("Test successful\n");
	return EXIT_SUCCESS;
}